

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NurbsCurveGeometry.h
# Opt level: O2

Index __thiscall anurbs::NurbsCurveGeometry<3L>::span_at(NurbsCurveGeometry<3L> *this,double t)

{
  int iVar1;
  undefined4 extraout_var;
  Index IVar2;
  double local_50;
  Ref<const_Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0,_Eigen::InnerStride<1>_> local_48;
  
  local_50 = t;
  iVar1 = (*(this->super_CurveBase<3L>)._vptr_CurveBase[2])();
  knots(&local_48,this);
  IVar2 = Nurbs::
          upper_span<Eigen::Ref<Eigen::Matrix<double,_1,1,0,_1,1>const,0,Eigen::InnerStride<1>>>
                    (CONCAT44(extraout_var,iVar1),&local_48,&local_50);
  free(local_48.m_object.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
       m_data);
  return IVar2;
}

Assistant:

Index span_at(const double t) const
    {
        return Nurbs::upper_span(degree(), knots(), t);
    }